

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O0

ThreadCache * tcmalloc::ThreadCache::Current(void)

{
  ThreadCache *this;
  long *in_FS_OFFSET;
  ThreadCache *cache;
  
  if (*(long *)(*in_FS_OFFSET + -8) == 0) {
    std::mutex::lock((mutex *)global_lock);
    if ((global_inited & 1) == 0) {
      GlobalInit();
    }
    if ((global_inited & 1) == 0) {
      __assert_fail("global_inited",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/thread_cache.hpp"
                    ,0xf0,"static ThreadCache *tcmalloc::ThreadCache::Current()");
    }
    this = FixedAllocator<tcmalloc::ThreadCache>::Alloc
                     ((FixedAllocator<tcmalloc::ThreadCache> *)thread_cache_allocator);
    Init(this);
    *(ThreadCache **)(*in_FS_OFFSET + -8) = this;
    std::mutex::unlock((mutex *)global_lock);
    pthread_setspecific(spec_key,this);
    std::mutex::lock((mutex *)global_lock);
    CacheListInsert((ThreadCache *)cache_list,this);
    std::mutex::unlock((mutex *)global_lock);
    cache = *(ThreadCache **)(*in_FS_OFFSET + -8);
  }
  else {
    cache = *(ThreadCache **)(*in_FS_OFFSET + -8);
  }
  return cache;
}

Assistant:

static ThreadCache* Current() {
        if (tls_cache != nullptr) return tls_cache;

        global_lock.lock();
        if (!global_inited) {
            ThreadCache::GlobalInit();
        }
        assert(global_inited);
        ThreadCache* cache = thread_cache_allocator.Alloc();
        cache->Init();
        // pthread_setspecific可能调用malloc递归回这个函数
        // 先设置tls_cache递归基，再调用pthread_setspecific
        tls_cache = cache;
        global_lock.unlock();
        pthread_setspecific(spec_key, cache);

        global_lock.lock();
        CacheListInsert(&cache_list, cache);
        global_lock.unlock();
        return tls_cache;
    }